

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  Fts5StructureLevel *pFVar1;
  int iVar2;
  Fts5Structure *pFVar3;
  long lVar4;
  
  if (*pRc != 0) {
    return;
  }
  pFVar3 = *ppStruct;
  lVar4 = (long)pFVar3->nLevel;
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    pFVar3 = (Fts5Structure *)sqlite3Realloc(pFVar3,lVar4 * 0x10 + 0x38);
  }
  else {
    pFVar3 = (Fts5Structure *)0x0;
  }
  if (pFVar3 == (Fts5Structure *)0x0) {
    *pRc = 7;
  }
  else {
    pFVar1 = pFVar3->aLevel + lVar4;
    pFVar1->nMerge = 0;
    pFVar1->nSeg = 0;
    pFVar1->aSeg = (Fts5StructureSegment *)0x0;
    pFVar3->nLevel = pFVar3->nLevel + 1;
    *ppStruct = pFVar3;
  }
  return;
}

Assistant:

static void fts5StructureAddLevel(int *pRc, Fts5Structure **ppStruct){
  if( *pRc==SQLITE_OK ){
    Fts5Structure *pStruct = *ppStruct;
    int nLevel = pStruct->nLevel;
    sqlite3_int64 nByte = (
        sizeof(Fts5Structure) +                  /* Main structure */
        sizeof(Fts5StructureLevel) * (nLevel+1)  /* aLevel[] array */
    );

    pStruct = sqlite3_realloc64(pStruct, nByte);
    if( pStruct ){
      memset(&pStruct->aLevel[nLevel], 0, sizeof(Fts5StructureLevel));
      pStruct->nLevel++;
      *ppStruct = pStruct;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}